

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

size_t varint_to_bytes(uint64_t v,uchar *bytes_out)

{
  if (v < 0xfd) {
    *bytes_out = (uchar)v;
    return 1;
  }
  if (v < 0x10000) {
    *bytes_out = 0xfd;
    *(short *)(bytes_out + 1) = (short)v;
    return 3;
  }
  if (v >> 0x20 == 0) {
    *bytes_out = 0xfe;
    *(int *)(bytes_out + 1) = (int)v;
    return 5;
  }
  *bytes_out = 0xff;
  *(uint64_t *)(bytes_out + 1) = v;
  return 9;
}

Assistant:

size_t varint_to_bytes(uint64_t v, unsigned char *bytes_out)
{
    if (v <= VI_MAX_8)
        return uint8_to_le_bytes(v, bytes_out);
    else if (v <= VI_MAX_16) {
        *bytes_out++ = VI_TAG_16;
        return sizeof(uint8_t) + uint16_to_le_bytes(v, bytes_out);
    } else if (v <= VI_MAX_32) {
        *bytes_out++ = VI_TAG_32;
        return sizeof(uint8_t) + uint32_to_le_bytes(v, bytes_out);
    }
    *bytes_out++ = VI_TAG_64;
    return sizeof(uint8_t) + uint64_to_le_bytes(v, bytes_out);
}